

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>::
cmd_result(cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>
           *this,handler_type *handler)

{
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_RDI;
  nullptr_t in_stack_ffffffffffffffb8;
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *this_00;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *__x;
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *this_01;
  
  this_00 = in_RDI;
  std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x142145);
  __x = (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
         *)&(in_RDI->super__Function_base)._M_manager;
  std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x142158);
  this_01 = in_RDI + 1;
  std::shared_ptr<nuraft::rpc_exception>::shared_ptr((shared_ptr<nuraft::rpc_exception> *)0x14216b);
  *(undefined4 *)&in_RDI[1].super__Function_base._M_manager = 0;
  *(undefined1 *)((long)&in_RDI[1].super__Function_base._M_manager + 4) = 1;
  *(undefined1 *)((long)&in_RDI[1].super__Function_base._M_manager + 5) = 0;
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            *)this_01,__x);
  std::
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  ::function(this_00,in_stack_ffffffffffffffb8);
  std::mutex::mutex((mutex *)0x1421af);
  std::condition_variable::condition_variable((condition_variable *)(this_00 + 5));
  return;
}

Assistant:

explicit cmd_result(const handler_type& handler)
        : err_()
        , code_(cmd_result_code::OK)
        , has_result_(true)
        , accepted_(false)
        , handler_(handler)
        , handler2_(nullptr)
        {}